

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

void __thiscall
ScenePreprocessorTest::CheckIfOnly(ScenePreprocessorTest *this,aiMesh *p,uint num,uint flag)

{
  bool bVar1;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  uint local_20;
  uint i;
  uint flag_local;
  uint num_local;
  aiMesh *p_local;
  ScenePreprocessorTest *this_local;
  
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < p->mNumFaces;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    p->mFaces[gtest_ar.message_.ptr_._4_4_].mNumIndices = num;
  }
  local_20 = flag;
  i = num;
  _flag_local = p;
  p_local = (aiMesh *)this;
  Assimp::ScenePreprocessor::ProcessMesh(this->mScenePreprocessor,p);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_38,"flag","p->mPrimitiveTypes",&local_20,
             &_flag_local->mPrimitiveTypes);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  _flag_local->mPrimitiveTypes = 0;
  return;
}

Assistant:

void ScenePreprocessorTest::CheckIfOnly(aiMesh* p, unsigned int num, unsigned int flag) {
    // Triangles only
    for (unsigned i = 0; i < p->mNumFaces;++i) {
        p->mFaces[i].mNumIndices = num;
    }
    mScenePreprocessor->ProcessMesh(p);
    EXPECT_EQ(flag, p->mPrimitiveTypes);
    p->mPrimitiveTypes = 0;
}